

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader_suite.cpp
# Opt level: O2

void basic_suite::test_string(void)

{
  bool bVar1;
  char input [8];
  reader reader;
  uint local_18c;
  return_type local_188;
  char local_168 [8];
  basic_reader<char> local_160;
  
  builtin_strncpy(local_168,"\"alpha\"",8);
  local_188._M_dataplus._M_p = (pointer)strlen(local_168);
  local_188._M_string_length = (size_type)local_168;
  trial::protocol::json::basic_reader<char>::basic_reader(&local_160,(view_type *)&local_188);
  local_18c = 10;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("reader.code()","token::code::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xb0,"void basic_suite::test_string()",&local_188,&local_18c);
  local_188._M_dataplus._M_p._0_4_ =
       trial::protocol::json::token::symbol::convert(local_160.decoder.current.code);
  local_18c = 6;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::symbol::value,trial::protocol::json::token::symbol::value>
            ("reader.symbol()","token::symbol::string",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xb1,"void basic_suite::test_string()",&local_188,&local_18c);
  local_188._M_dataplus._M_p._0_4_ = trial::protocol::json::basic_reader<char>::category(&local_160)
  ;
  local_18c = 2;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::category::value,trial::protocol::json::token::category::value>
            ("reader.category()","token::category::data",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xb2,"void basic_suite::test_string()",&local_188,&local_18c);
  trial::protocol::json::basic_reader<char>::
  overloader<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
  ::value(&local_188,&local_160);
  boost::detail::test_with_impl<boost::detail::lw_test_eq,std::__cxx11::string,char[6]>
            ("reader.value<std::string>()","\"alpha\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xb3,"void basic_suite::test_string()",&local_188,"alpha");
  std::__cxx11::string::~string((string *)&local_188);
  local_188._M_dataplus._M_p =
       local_160.decoder.current.view.tail + -(long)local_160.decoder.current.view.head;
  local_188._M_string_length = (size_type)local_160.decoder.current.view.head;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,std::basic_string_view<char,std::char_traits<char>>,char[8]>
            ("reader.literal()","\"\\\"alpha\\\"\"",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xb4,"void basic_suite::test_string()",&local_188,"\"alpha\"");
  bVar1 = trial::protocol::json::basic_reader<char>::next(&local_160);
  local_188._M_dataplus._M_p._0_1_ = bVar1;
  local_18c = local_18c & 0xffffff00;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("reader.next()","false",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/reader_suite.cpp"
             ,0xb5,"void basic_suite::test_string()",&local_188,&local_18c);
  std::
  _Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
  ::~_Vector_base((_Vector_base<trial::protocol::json::basic_reader<char>::frame,_std::allocator<trial::protocol::json::basic_reader<char>::frame>_>
                   *)&local_160.stack);
  return;
}

Assistant:

void test_string()
{
    const char input[] = "\"alpha\"";
    json::reader reader(input);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.code(), token::code::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.symbol(), token::symbol::string);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.category(), token::category::data);
    TRIAL_PROTOCOL_TEST_EQUAL(reader.value<std::string>(), "alpha");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.literal(), "\"alpha\"");
    TRIAL_PROTOCOL_TEST_EQUAL(reader.next(), false);
}